

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       map_caster<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>,std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
       ::
       cast<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>const&>
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  _Base_ptr p_Var1;
  handle hVar2;
  item_accessor local_70;
  _Rb_tree_node_base *local_50;
  object local_48;
  object value;
  object key;
  dict d;
  
  dict::dict((dict *)&key);
  p_Var1 = (src->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(src->_M_t)._M_impl.super__Rb_tree_header._M_header;
  do {
    hVar2 = key.super_handle.m_ptr;
    if (p_Var1 == local_50) {
      key.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_00351079:
      object::~object(&key);
      return (handle)hVar2.m_ptr;
    }
    value.super_handle =
         string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ::cast((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1),
                policy,parent);
    local_48.super_handle =
         tuple_caster<std::tuple,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
         ::
         cast_impl<std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>const&,0ul,1ul,2ul,3ul,4ul>
                   (p_Var1 + 2,policy,parent.m_ptr);
    if ((value.super_handle.m_ptr == (PyObject *)0x0) ||
       (local_48.super_handle.m_ptr == (PyObject *)0x0)) {
      object::~object(&local_48);
      object::~object(&value);
      hVar2.m_ptr = (PyObject *)0x0;
      goto LAB_00351079;
    }
    object_api<pybind11::handle>::operator[]
              (&local_70,(object_api<pybind11::handle> *)&key,value.super_handle.m_ptr);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_70,&local_48);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_70);
    object::~object(&local_48);
    object::~object(&value);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }